

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void on_mouse(int event,int x,int y,int flags,void *ustc)

{
  int local_58;
  int local_54;
  undefined4 local_50 [2];
  undefined1 *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (obs_set || event != 1) {
    if (obs_set) {
      orient.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
           = (double)x;
      orient.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
           = (double)y;
      render_flag = true;
      if (event == 1) {
        printf("Now angle: %.4lf\n",(angle * 180.0) / 3.141592653589793);
        return;
      }
    }
  }
  else {
    printf("cv::Point(%d, %d),\n",x,(ulong)(uint)y);
    obs.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         (double)x;
    obs.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         (double)y;
    uStack_40 = 0;
    local_50[0] = 0x3010000;
    local_48 = src;
    local_38 = 0;
    local_28 = 0;
    uStack_20 = 0;
    uStack_30 = 0x406fe00000000000;
    local_58 = x;
    local_54 = y;
    cv::circle(local_50,&local_58,3,&local_38,0xffffffff,8,0);
    obs_set = true;
  }
  return;
}

Assistant:

void on_mouse(int event, int x, int y, int flags, void *ustc) {
    if (event == cv::EVENT_LBUTTONDOWN && obs_set == false) {
        printf("cv::Point(%d, %d),\n", x, y);
        obs(0) = double(x);
        obs(1) = double(y);
        cv::circle(src, cv::Point(x, y), 3, cv::Scalar(0, 255, 0), -1);
        obs_set = true;
    } else if (obs_set == true) {
        orient(0) = double(x);
        orient(1) = double(y);
        render_flag = true;
        if (event == cv::EVENT_LBUTTONDOWN) {
            printf("Now angle: %.4lf\n", angle * 180.0 / M_PI);
        }
    } 
}